

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_open_file.c
# Opt level: O3

int archive_read_open_FILE(archive *a,FILE *f)

{
  int iVar1;
  undefined8 *client_data;
  void *__ptr;
  stat st;
  stat local_b0;
  
  archive_clear_error(a);
  client_data = (undefined8 *)calloc(1,0x20);
  __ptr = malloc(0x20000);
  if (client_data == (undefined8 *)0x0 || __ptr == (void *)0x0) {
    archive_set_error(a,0xc,"No memory");
    free(client_data);
    free(__ptr);
    return -0x1e;
  }
  client_data[1] = 0x20000;
  client_data[2] = __ptr;
  *client_data = f;
  iVar1 = fileno((FILE *)f);
  iVar1 = fstat(iVar1,&local_b0);
  if ((iVar1 == 0) && ((local_b0.st_mode & 0xf000) == 0x8000)) {
    archive_read_extract_set_skip_file(a,local_b0.st_dev,local_b0.st_ino);
    *(undefined1 *)(client_data + 3) = 1;
  }
  archive_read_set_read_callback(a,FILE_read);
  archive_read_set_skip_callback(a,FILE_skip);
  archive_read_set_seek_callback(a,FILE_seek);
  archive_read_set_close_callback(a,FILE_close);
  archive_read_set_callback_data(a,client_data);
  iVar1 = archive_read_open1(a);
  return iVar1;
}

Assistant:

int
archive_read_open_FILE(struct archive *a, FILE *f)
{
	struct stat st;
	struct read_FILE_data *mine;
	size_t block_size = 128 * 1024;
	void *b;

	archive_clear_error(a);
	mine = calloc(1, sizeof(*mine));
	b = malloc(block_size);
	if (mine == NULL || b == NULL) {
		archive_set_error(a, ENOMEM, "No memory");
		free(mine);
		free(b);
		return (ARCHIVE_FATAL);
	}
	mine->block_size = block_size;
	mine->buffer = b;
	mine->f = f;
	/*
	 * If we can't fstat() the file, it may just be that it's not
	 * a file.  (On some platforms, FILE * objects can wrap I/O
	 * streams that don't support fileno()).  As a result, fileno()
	 * should be used cautiously.)
	 */
	if (fstat(fileno(mine->f), &st) == 0 && S_ISREG(st.st_mode)) {
		archive_read_extract_set_skip_file(a, st.st_dev, st.st_ino);
		/* Enable the seek optimization only for regular files. */
		mine->can_skip = 1;
	}

#if defined(__CYGWIN__) || defined(_WIN32)
	setmode(fileno(mine->f), O_BINARY);
#endif

	archive_read_set_read_callback(a, FILE_read);
	archive_read_set_skip_callback(a, FILE_skip);
	archive_read_set_seek_callback(a, FILE_seek);
	archive_read_set_close_callback(a, FILE_close);
	archive_read_set_callback_data(a, mine);
	return (archive_read_open1(a));
}